

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int SwapActorTeleFog(AActor *activator,int tid)

{
  AActor *pAVar1;
  AActor *actor;
  FActorIterator iterator;
  int count;
  int tid_local;
  AActor *activator_local;
  
  iterator.id = 0;
  iterator._12_4_ = tid;
  if (tid == 0) {
    if ((activator == (AActor *)0x0) || (activator->TeleFogSourceType == activator->TeleFogDestType)
       ) {
      activator_local._4_4_ = 0;
    }
    else {
      swapvalues<PClassActor*>(&activator->TeleFogSourceType,&activator->TeleFogDestType);
      activator_local._4_4_ = 1;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)&actor,tid);
    while (pAVar1 = FActorIterator::Next((FActorIterator *)&actor), pAVar1 != (AActor *)0x0) {
      if (pAVar1->TeleFogSourceType != pAVar1->TeleFogDestType) {
        swapvalues<PClassActor*>(&pAVar1->TeleFogSourceType,&pAVar1->TeleFogDestType);
        iterator.id = iterator.id + 1;
      }
    }
    activator_local._4_4_ = iterator.id;
  }
  return activator_local._4_4_;
}

Assistant:

static int SwapActorTeleFog(AActor *activator, int tid)
{
	int count = 0;
	if (tid == 0)
	{
		if ((activator == NULL) || (activator->TeleFogSourceType == activator->TeleFogDestType)) 
			return 0; //Does nothing if they're the same.

		swapvalues (activator->TeleFogSourceType, activator->TeleFogDestType);
		return 1;
	}
	else
	{
		FActorIterator iterator(tid);
		AActor *actor;
		
		while ((actor = iterator.Next()))
		{
			if (actor->TeleFogSourceType == actor->TeleFogDestType) 
				continue; //They're the same. Save the effort.

			swapvalues (actor->TeleFogSourceType, actor->TeleFogDestType);
			count++;
		}
	}
	return count;
}